

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O0

void kj::anon_unknown_70::terminateHandler(void)

{
  bool bVar1;
  size_t in_RCX;
  size_t sVar2;
  char *in_R8;
  char *in_R9;
  ArrayPtr<void_*const> trace_00;
  ArrayPtr<void_*> space;
  ArrayPtr<void_*const> trace_01;
  ArrayPtr<void_*const> trace_02;
  ArrayPtr<void_*const> trace_03;
  undefined1 auVar3 [12];
  char *in_stack_fffffffffffffc60;
  ArrayPtr<unsigned_char> local_360;
  ArrayPtr<const_unsigned_char> local_350;
  FdOutputStream local_340;
  String local_329;
  String local_310;
  kj *local_2f8;
  void **ppvStack_2f0;
  String local_2e8;
  String local_2d0;
  undefined1 local_2b1 [33];
  Exception *exception;
  kj *local_288;
  void **ppvStack_280;
  String local_270;
  kj *local_258;
  void **ppvStack_250;
  String local_240;
  char local_228 [8];
  String local_220;
  long *local_208;
  exception *exception_1;
  kj *local_1f8;
  void **ppvStack_1f0;
  String local_1e0;
  kj *local_1c8;
  void **ppvStack_1c0;
  String local_1b0;
  String local_198;
  String local_180;
  int local_164;
  void *local_160;
  exception_ptr local_158;
  exception_ptr local_150;
  exception_ptr local_148;
  exception_ptr eptr;
  String message;
  void **local_120;
  kj *pkStack_118;
  ArrayPtr<void_*const> trace;
  void *traceSpace [32];
  
  memset(&trace.size_,0,0x100);
  ArrayPtr<void*>::ArrayPtr<32ul>
            ((ArrayPtr<void*> *)&message.content.disposer,(void *(*) [32])&trace.size_);
  space.size_ = 3;
  space.ptr = local_120;
  trace_00 = getStackTrace((kj *)message.content.disposer,space,(uint)in_RCX);
  String::String((String *)&eptr);
  std::current_exception();
  std::__exception_ptr::exception_ptr::exception_ptr(&local_150,(nullptr_t)0x0);
  bVar1 = std::__exception_ptr::operator==(&local_148,&local_150);
  std::__exception_ptr::exception_ptr::~exception_ptr(&local_150);
  pkStack_118 = (kj *)trace_00.ptr;
  trace.ptr = (void **)trace_00.size_;
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_2f8 = pkStack_118;
    ppvStack_2f0 = trace.ptr;
    trace_03.size_ = in_RCX;
    trace_03.ptr = trace.ptr;
    stringifyStackTraceAddresses(&local_2e8,pkStack_118,trace_03);
    local_329.content._1_8_ = pkStack_118;
    local_329.content._9_8_ = trace.ptr;
    stringifyStackTrace(&local_310,trace_00);
    local_329.content.ptr._0_1_ = 10;
    str<char_const(&)[54],kj::String,kj::String,char>
              (&local_2d0,(kj *)"*** std::terminate() called with no exception\nstack: ",
               (char (*) [54])&local_2e8,&local_310,&local_329,in_R9);
    String::operator=((String *)&eptr,&local_2d0);
    String::~String(&local_2d0);
    String::~String(&local_310);
    String::~String(&local_2e8);
  }
  else {
    std::__exception_ptr::exception_ptr::exception_ptr(&local_158,&local_148);
    auVar3 = std::rethrow_exception((exception_ptr)&local_158);
    local_164 = auVar3._8_4_;
    local_160 = auVar3._0_8_;
    std::__exception_ptr::exception_ptr::~exception_ptr(&local_158);
    if (local_164 == 3) {
      local_2b1._25_8_ = __cxa_begin_catch(local_160);
      local_2b1[0] = 10;
      str<char_const(&)[35],kj::Exception_const&,char>
                ((String *)(local_2b1 + 1),(kj *)"*** Fatal uncaught kj::Exception: ",
                 (char (*) [35])local_2b1._25_8_,(Exception *)local_2b1,in_R8);
      String::operator=((String *)&eptr,(String *)(local_2b1 + 1));
      String::~String((String *)(local_2b1 + 1));
      __cxa_end_catch();
    }
    else {
      sVar2 = 2;
      if (local_164 == 2) {
        local_208 = (long *)__cxa_begin_catch(local_160);
        local_228 = (char  [8])(**(code **)(*local_208 + 0x10))();
        local_258 = pkStack_118;
        ppvStack_250 = trace.ptr;
        trace_01.size_ = sVar2;
        trace_01.ptr = trace.ptr;
        stringifyStackTraceAddresses(&local_240,pkStack_118,trace_01);
        local_288 = pkStack_118;
        ppvStack_280 = trace.ptr;
        stringifyStackTrace(&local_270,trace_00);
        exception._7_1_ = 10;
        str<char_const(&)[36],char_const*,char_const(&)[9],kj::String,kj::String,char>
                  (&local_220,(kj *)"*** Fatal uncaught std::exception: ",(char (*) [36])local_228,
                   (char **)0xa81ed8,(char (*) [9])&local_240,&local_270,
                   (String *)((long)&exception + 7),in_stack_fffffffffffffc60);
        String::operator=((String *)&eptr,&local_220);
        String::~String(&local_220);
        String::~String(&local_270);
        String::~String(&local_240);
        __cxa_end_catch();
      }
      else {
        __cxa_begin_catch(local_160);
        getCaughtExceptionType();
        local_1c8 = pkStack_118;
        ppvStack_1c0 = trace.ptr;
        trace_02.size_ = sVar2;
        trace_02.ptr = trace.ptr;
        stringifyStackTraceAddresses(&local_1b0,pkStack_118,trace_02);
        local_1f8 = pkStack_118;
        ppvStack_1f0 = trace.ptr;
        stringifyStackTrace(&local_1e0,trace_00);
        exception_1._7_1_ = 10;
        str<char_const(&)[39],kj::String,char_const(&)[9],kj::String,kj::String,char>
                  (&local_180,(kj *)"*** Fatal uncaught exception of type: ",
                   (char (*) [39])&local_198,(String *)0xa81ed8,(char (*) [9])&local_1b0,&local_1e0,
                   (String *)((long)&exception_1 + 7),in_stack_fffffffffffffc60);
        String::operator=((String *)&eptr,&local_180);
        String::~String(&local_180);
        String::~String(&local_1e0);
        String::~String(&local_1b0);
        String::~String(&local_198);
        __cxa_end_catch();
      }
    }
  }
  FdOutputStream::FdOutputStream(&local_340,2);
  local_360 = String::asBytes((String *)&eptr);
  local_350 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)&local_360);
  FdOutputStream::write(&local_340,(int)local_350.ptr,(void *)local_350.size_,(size_t)local_350.ptr)
  ;
  FdOutputStream::~FdOutputStream(&local_340);
  _exit(1);
}

Assistant:

[[noreturn]] void terminateHandler() {
  void* traceSpace[32]{};

  // ignoreCount = 3 to ignore std::terminate entry.
  auto trace = kj::getStackTrace(traceSpace, 3);

  kj::String message;

  auto eptr = std::current_exception();
  if (eptr != nullptr) {
    try {
      std::rethrow_exception(eptr);
    } catch (const kj::Exception& exception) {
      message = kj::str("*** Fatal uncaught kj::Exception: ", exception, '\n');
    } catch (const std::exception& exception) {
      message = kj::str("*** Fatal uncaught std::exception: ", exception.what(),
                        "\nstack: ", stringifyStackTraceAddresses(trace),
                                     stringifyStackTrace(trace), '\n');
    } catch (...) {
      message = kj::str("*** Fatal uncaught exception of type: ", kj::getCaughtExceptionType(),
                        "\nstack: ", stringifyStackTraceAddresses(trace),
                                     stringifyStackTrace(trace), '\n');
    }
  } else {
    message = kj::str("*** std::terminate() called with no exception"
                      "\nstack: ", stringifyStackTraceAddresses(trace),
                                   stringifyStackTrace(trace), '\n');
  }

  kj::FdOutputStream(STDERR_FILENO).write(message.asBytes());
  _exit(1);
}